

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

OperatorResultType
duckdb::RangeDateTimeFunction<true>
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  long lVar1;
  long lVar2;
  data_ptr_t pdVar3;
  AddOperator *this;
  bool bVar4;
  RangeDateTimeLocalState *this_00;
  reference pvVar5;
  long lVar6;
  timestamp_t tVar7;
  BinderException *pBVar8;
  undefined7 uVar10;
  DataChunk *pDVar9;
  ulong uVar11;
  idx_t c;
  ulong uVar12;
  interval_t right;
  allocator local_59;
  string local_58;
  timestamp_t *local_38;
  
  pDVar9 = output;
  this_00 = (RangeDateTimeLocalState *)
            optional_ptr<duckdb::LocalTableFunctionState,_true>::operator->(&data_p->local_state);
  local_38 = &this_00->start;
  if ((this_00->initialized_row & 1U) != 0) goto LAB_00885753;
  do {
    uVar11 = this_00->current_input_row;
    if (input->count <= uVar11) {
      this_00->current_input_row = 0;
      this_00->initialized_row = false;
      return NEED_MORE_INPUT;
    }
    DataChunk::Flatten(input);
    uVar12 = 0;
    do {
      if ((ulong)(((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x68) <= uVar12) {
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
        (this_00->start).value = *(int64_t *)(pvVar5->data + uVar11 * 8);
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
        (this_00->end).value = *(int64_t *)(pvVar5->data + uVar11 * 8);
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,2);
        uVar12 = *(ulong *)(pvVar5->data + uVar11 * 0x10);
        lVar1 = *(long *)(pvVar5->data + uVar11 * 0x10 + 8);
        (this_00->increment).months = (int)uVar12;
        (this_00->increment).days = (int)(uVar12 >> 0x20);
        (this_00->increment).micros = lVar1;
        lVar6 = (this_00->start).value;
        if ((((lVar6 == -0x7fffffffffffffff) || (lVar6 == 0x7fffffffffffffff)) ||
            (lVar2 = (this_00->end).value, lVar2 == 0x7fffffffffffffff)) ||
           (lVar2 == -0x7fffffffffffffff)) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_58,"RANGE with infinite bounds is not supported",&local_59);
          BinderException::BinderException(pBVar8,&local_58);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((lVar1 == 0 && (int)uVar12 == 0) && uVar12 >> 0x20 == 0) {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string((string *)&local_58,"interval cannot be 0!",&local_59);
          BinderException::BinderException(pBVar8,&local_58);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar10 = (undefined7)((ulong)lVar1 >> 8);
        if ((lVar1 < 1 && (int)uVar12 < 1) && (int)(uVar12 >> 0x20) < 1) {
          this_00->greater_than_check = false;
          pDVar9 = (DataChunk *)CONCAT71(uVar10,1);
          if (lVar2 <= lVar6) goto LAB_00885746;
        }
        else {
          if (((uVar12 & 0x8000000080000000) != 0) || (lVar1 < 0)) {
            pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_58,
                       "RANGE with composite interval that has mixed signs is not supported",
                       &local_59);
            BinderException::BinderException(pBVar8,&local_58);
            __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          this_00->greater_than_check = true;
          pDVar9 = (DataChunk *)CONCAT71(uVar10,1);
          if (lVar6 <= lVar2) goto LAB_00885746;
        }
        this_00->empty_range = true;
        pDVar9 = (DataChunk *)CONCAT71(uVar10,1);
        goto LAB_00885746;
      }
      pvVar5 = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar12);
      bVar4 = FlatVector::IsNull(pvVar5,uVar11);
      uVar12 = uVar12 + 1;
    } while (!bVar4);
    *(int32_t *)&local_38[2].value = 0;
    *(int32_t *)((long)&local_38[2].value + 4) = 0;
    local_38[3] = 0;
    local_38->value = 0;
    local_38[1].value = 0;
    this_00->greater_than_check = true;
    lVar6 = 0;
    pDVar9 = (DataChunk *)0x0;
LAB_00885746:
    this_00->inclusive_bound = SUB81(pDVar9,0);
    this_00->initialized_row = true;
    (this_00->current_state).value = lVar6;
LAB_00885753:
    if (this_00->empty_range == true) {
      output->count = 0;
      this_00->current_input_row = this_00->current_input_row + 1;
      this_00->initialized_row = false;
      return HAVE_MORE_OUTPUT;
    }
    pvVar5 = vector<duckdb::Vector,_true>::get<true>(&output->data,0);
    pdVar3 = pvVar5->data;
    tVar7.value = (this_00->current_state).value;
    for (uVar11 = 0;
        (bVar4 = RangeDateTimeLocalState::Finished(this_00,tVar7), !bVar4 && (uVar11 < 0x800));
        uVar11 = uVar11 + 1) {
      this = (AddOperator *)(this_00->current_state).value;
      *(AddOperator **)(pdVar3 + uVar11 * 8) = this;
      tVar7.value._0_4_ = (this_00->increment).months;
      tVar7.value._4_4_ = (this_00->increment).days;
      right.micros = (int64_t)pDVar9;
      right._0_8_ = (this_00->increment).micros;
      tVar7 = AddOperator::Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>
                        (this,tVar7,right);
      (this_00->current_state).value = tVar7.value;
    }
    if (uVar11 != 0) {
      output->count = uVar11;
      return HAVE_MORE_OUTPUT;
    }
    this_00->current_input_row = this_00->current_input_row + 1;
    this_00->initialized_row = false;
  } while( true );
}

Assistant:

static OperatorResultType RangeDateTimeFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                                DataChunk &output) {
	auto &state = data_p.local_state->Cast<RangeDateTimeLocalState>();
	while (true) {
		if (!state.initialized_row) {
			// initialize for the current input row
			if (state.current_input_row >= input.size()) {
				// ran out of rows
				state.current_input_row = 0;
				state.initialized_row = false;
				return OperatorResultType::NEED_MORE_INPUT;
			}
			GenerateRangeDateTimeParameters<GENERATE_SERIES>(input, state.current_input_row, state);
			state.initialized_row = true;
			state.current_state = state.start;
		}
		if (state.empty_range) {
			// empty range
			output.SetCardinality(0);
			state.current_input_row++;
			state.initialized_row = false;
			return OperatorResultType::HAVE_MORE_OUTPUT;
		}
		idx_t size = 0;
		auto data = FlatVector::GetData<timestamp_t>(output.data[0]);
		while (true) {
			if (state.Finished(state.current_state)) {
				break;
			}
			if (size >= STANDARD_VECTOR_SIZE) {
				break;
			}
			data[size++] = state.current_state;
			state.current_state =
			    AddOperator::Operation<timestamp_t, interval_t, timestamp_t>(state.current_state, state.increment);
		}
		if (size == 0) {
			// move to next row
			state.current_input_row++;
			state.initialized_row = false;
			continue;
		}
		output.SetCardinality(size);
		return OperatorResultType::HAVE_MORE_OUTPUT;
	}
}